

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::
thread_remove_scheduling
          (MicrothreadManager<implementations::brainfck::BFImplementation> *this,
          _threads_iterator thread)

{
  iterator iVar1;
  
  iVar1 = getSchedulingFor(this,thread);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->scheduling)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_std::_Identity<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::less<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>_>
    ::erase(&(this->scheduling)._M_t,(key_type *)(iVar1._M_node + 1));
    return;
  }
  return;
}

Assistant:

void thread_remove_scheduling(_threads_iterator thread) {
				auto it = getSchedulingFor(thread);
				if (it != scheduling.end()) {
					scheduling.erase(*it);
				}
			}